

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O0

string * __thiscall
t_go_generator::type_to_go_type_with_opt_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *type,bool optional_field)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  t_type *ptVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var;
  string local_2d8;
  string local_2b8;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 local_250 [8];
  string elemType_1;
  t_list *t_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string elemType;
  t_set *t_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string valueType;
  string keyType;
  t_map *t;
  string local_c8;
  string local_a8;
  string local_88;
  undefined4 local_64;
  t_base local_60;
  t_base tbase;
  allocator local_49;
  undefined1 local_48 [8];
  string maybe_pointer;
  t_map *ptStack_20;
  bool optional_field_local;
  t_type *type_local;
  t_go_generator *this_local;
  
  pcVar4 = "";
  if (optional_field) {
    pcVar4 = "*";
  }
  maybe_pointer.field_2._M_local_buf[0xf] = optional_field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,pcVar4,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  uVar2 = (*(type->super_t_doc)._vptr_t_doc[9])();
  ptStack_20 = (t_map *)type;
  if (((uVar2 & 1) != 0) && (bVar1 = t_typedef::is_forward_typedef((t_typedef *)type), bVar1)) {
    ptStack_20 = (t_map *)t_type::get_true_type(type);
  }
  uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
      if (((uVar2 & 1) == 0) &&
         (uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
         (uVar2 & 1) == 0)) {
        uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
        if ((uVar2 & 1) == 0) {
          uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
          if ((uVar2 & 1) == 0) {
            uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
            if ((uVar2 & 1) == 0) {
              uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[9])();
              if ((uVar2 & 1) == 0) goto switchD_002a4c3a_default;
              type_name_abi_cxx11_(&local_2d8,this,(t_type *)ptStack_20);
              publicize(&local_2b8,this,&local_2d8,false);
              std::operator+(__return_storage_ptr__,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48,&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2d8);
              local_64 = 1;
            }
            else {
              elemType_1.field_2._8_8_ = ptStack_20;
              ptVar6 = t_list::get_elem_type((t_list *)ptStack_20);
              type_to_go_type_abi_cxx11_((string *)local_250,this,ptVar6);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_290,"[]",&local_291);
              std::operator+(&local_270,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_48,&local_290);
              std::operator+(__return_storage_ptr__,&local_270,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_250);
              std::__cxx11::string::~string((string *)&local_270);
              std::__cxx11::string::~string((string *)&local_290);
              std::allocator<char>::~allocator((allocator<char> *)&local_291);
              local_64 = 1;
              std::__cxx11::string::~string((string *)local_250);
            }
          }
          else {
            elemType.field_2._8_8_ = ptStack_20;
            ptVar6 = t_set::get_elem_type((t_set *)ptStack_20);
            type_to_go_type_abi_cxx11_((string *)local_1e0,this,ptVar6);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_220,"[]",(allocator *)((long)&t_2 + 7));
            std::operator+(&local_200,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_48,&local_220);
            std::operator+(__return_storage_ptr__,&local_200,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1e0);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator((allocator<char> *)((long)&t_2 + 7));
            local_64 = 1;
            std::__cxx11::string::~string((string *)local_1e0);
          }
        }
        else {
          ptVar6 = t_map::get_key_type(ptStack_20);
          type_to_go_key_type_abi_cxx11_((string *)((long)&valueType.field_2 + 8),this,ptVar6);
          ptVar6 = t_map::get_val_type(ptStack_20);
          type_to_go_type_abi_cxx11_((string *)local_130,this,ptVar6);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1b0,"map[",(allocator *)((long)&t_1 + 7));
          std::operator+(&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_48,&local_1b0);
          std::operator+(&local_170,&local_190,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&valueType.field_2 + 8));
          std::operator+(&local_150,&local_170,"]");
          std::operator+(__return_storage_ptr__,&local_150,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&t_1 + 7));
          local_64 = 1;
          std::__cxx11::string::~string((string *)local_130);
          std::__cxx11::string::~string((string *)(valueType.field_2._M_local_buf + 8));
        }
      }
      else {
        type_name_abi_cxx11_((string *)&t,this,(t_type *)ptStack_20);
        publicize(&local_c8,this,(string *)&t,false);
        std::operator+(__return_storage_ptr__,"*",&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&t);
        local_64 = 1;
      }
    }
    else {
      type_name_abi_cxx11_(&local_a8,this,(t_type *)ptStack_20);
      publicize(&local_88,this,&local_a8,false);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     &local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      local_64 = 1;
    }
  }
  else {
    local_60 = t_base_type::get_base((t_base_type *)ptStack_20);
    switch(local_60) {
    case TYPE_VOID:
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = "";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    case TYPE_STRING:
      uVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[7])();
      if ((uVar2 & 1) == 0) {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,"string");
        local_64 = 1;
      }
      else {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,"[]byte");
        local_64 = 1;
      }
      break;
    case TYPE_BOOL:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "bool");
      local_64 = 1;
      break;
    case TYPE_I8:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "int8");
      local_64 = 1;
      break;
    case TYPE_I16:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "int16");
      local_64 = 1;
      break;
    case TYPE_I32:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "int32");
      local_64 = 1;
      break;
    case TYPE_I64:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "int64");
      local_64 = 1;
      break;
    case TYPE_DOUBLE:
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "float64");
      local_64 = 1;
      break;
    default:
switchD_002a4c3a_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar3 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_go_type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var,iVar3));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::type_to_go_type_with_opt(t_type* type,
                                                bool optional_field) {
  string maybe_pointer(optional_field ? "*" : "");

  if (type->is_typedef() && ((t_typedef*)type)->is_forward_typedef()) {
    type = ((t_typedef*)type)->get_true_type();
  }

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();

    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "";

    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        return maybe_pointer + "[]byte";
      }

      return maybe_pointer + "string";

    case t_base_type::TYPE_BOOL:
      return maybe_pointer + "bool";

    case t_base_type::TYPE_I8:
      return maybe_pointer + "int8";

    case t_base_type::TYPE_I16:
      return maybe_pointer + "int16";

    case t_base_type::TYPE_I32:
      return maybe_pointer + "int32";

    case t_base_type::TYPE_I64:
      return maybe_pointer + "int64";

    case t_base_type::TYPE_DOUBLE:
      return maybe_pointer + "float64";
    }
  } else if (type->is_enum()) {
    return maybe_pointer + publicize(type_name(type));
  } else if (type->is_struct() || type->is_xception()) {
    return "*" + publicize(type_name(type));
  } else if (type->is_map()) {
    t_map* t = (t_map*)type;
    string keyType = type_to_go_key_type(t->get_key_type());
    string valueType = type_to_go_type(t->get_val_type());
    return maybe_pointer + string("map[") + keyType + "]" + valueType;
  } else if (type->is_set()) {
    t_set* t = (t_set*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_list()) {
    t_list* t = (t_list*)type;
    string elemType = type_to_go_type(t->get_elem_type());
    return maybe_pointer + string("[]") + elemType;
  } else if (type->is_typedef()) {
    return maybe_pointer + publicize(type_name(type));
  }

  throw "INVALID TYPE IN type_to_go_type: " + type->get_name();
}